

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>::
unsetCurrentWrapper(WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl> *this,
                   Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *weakRef)

{
  bool bVar1;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> **ppMVar2;
  Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&> local_a8 [2];
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> local_98;
  Fault local_90;
  Fault f;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *local_80;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *local_78;
  undefined1 local_70 [8];
  DebugComparison<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_*,_kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_*>
  _kjCondition;
  Fault local_30;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *local_28;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *_kj_result;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *current;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *weakRef_local;
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl> *this_local;
  
  current = weakRef;
  weakRef_local = (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)this;
  local_28 = kj::_::readMaybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>>
                       (&this->currentWrapper);
  if (local_28 == (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0) {
    kj::_::Debug::Fault::Fault
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x52c,FAILED,"currentWrapper != nullptr","");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  ppMVar2 = mv<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>*>(&local_28);
  local_80 = *ppMVar2;
  _kjCondition._32_8_ = local_80;
  _kj_result = local_80;
  local_78 = (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_80);
  f.exception = (Exception *)current;
  kj::_::DebugExpression<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>*>::operator==
            ((DebugComparison<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_*,_kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_*>
              *)local_70,
             (DebugExpression<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>*> *)
             &local_78,(Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> **)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_70);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>*,kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>*>&,char_const(&)[63]>
              (&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x52e,FAILED,"&current == &weakRef",
               "_kjCondition,\"bug in KJ HTTP: unsetCurrentWrapper() passed the wrong wrapper\"",
               (DebugComparison<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_*,_kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_*>
                *)local_70,
               (char (*) [63])"bug in KJ HTTP: unsetCurrentWrapper() passed the wrong wrapper");
    kj::_::Debug::Fault::fatal(&local_90);
  }
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>::Maybe(&local_98);
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>::operator=(current,&local_98);
  Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>::Maybe(local_a8);
  Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>::operator=
            (&this->currentWrapper,local_a8);
  return;
}

Assistant:

void unsetCurrentWrapper(kj::Maybe<Subclass&>& weakRef) {
    auto& current = KJ_ASSERT_NONNULL(currentWrapper);
    KJ_ASSERT(&current == &weakRef,
        "bug in KJ HTTP: unsetCurrentWrapper() passed the wrong wrapper");
    weakRef = kj::none;
    currentWrapper = kj::none;
  }